

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O0

TestResult *
JsonTest::checkEqual<int,unsigned_long>
          (TestResult *result,int expected,unsigned_long actual,char *file,uint line,char *expr)

{
  undefined8 in_RCX;
  char *in_RDX;
  int in_ESI;
  TestResult *in_RDI;
  undefined4 in_R8D;
  char (*in_stack_00000178) [11];
  TestResult *in_stack_00000180;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((char *)(long)in_ESI != in_RDX) {
    TestResult::addFailure
              ((TestResult *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
               (uint)((ulong)in_RCX >> 0x20),(char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8));
    TestResult::operator<<(in_stack_00000180,in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(unsigned_long *)in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(char (*) [2])in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(unsigned_long *)in_stack_00000178);
  }
  return in_RDI;
}

Assistant:

TestResult& checkEqual(TestResult& result,
                       T expected,
                       U actual,
                       const char* file,
                       unsigned int line,
                       const char* expr) {
  if (static_cast<U>(expected) != actual) {
    result.addFailure(file, line, expr);
    result << "Expected: " << static_cast<U>(expected) << "\n";
    result << "Actual  : " << actual;
  }
  return result;
}